

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::ReaderMgr::skippedChar(ReaderMgr *this,XMLCh toCheck)

{
  bool bVar1;
  bool bVar2;
  
  while( true ) {
    bVar1 = XMLReader::skippedChar(this->fCurReader,toCheck);
    if (bVar1) {
      return bVar1;
    }
    if (this->fCurReader->fNoMore != true) break;
    bVar2 = popReader(this);
    if (!bVar2) {
      return bVar1;
    }
  }
  return bVar1;
}

Assistant:

bool ReaderMgr::skippedChar(const XMLCh toCheck)
{
    while (true)
    {
        // If we get it, then just return true now
        if (fCurReader->skippedChar(toCheck))
            return true;

        //
        //  Check to see if we hit end of input on this reader. If so, then
        //  lets pop and try again. Else, we failed. If we cannot pop another
        //  then we failed.
        //
        if (!fCurReader->getNoMoreFlag())
            break;

        if (!popReader())
            break;
    }
    return false;
}